

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KLV.cpp
# Opt level: O2

KLVPacket * __thiscall
ASDCP::KLVPacket::WriteKLToBuffer(KLVPacket *this,FrameBuffer *Buffer,UL *label,ui32_t length)

{
  byte_t *pbVar1;
  undefined8 *puVar2;
  uint uVar3;
  undefined8 uVar4;
  char cVar5;
  ILogSink *this_00;
  undefined4 in_register_0000000c;
  long *plVar6;
  undefined1 *puVar7;
  uint in_R8D;
  
  plVar6 = (long *)CONCAT44(in_register_0000000c,length);
  cVar5 = (**(code **)(*plVar6 + 0x10))(plVar6);
  if (cVar5 == '\0') {
    __assert_fail("label.HasValue()",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KLV.cpp"
                  ,0x8e,
                  "virtual ASDCP::Result_t ASDCP::KLVPacket::WriteKLToBuffer(ASDCP::FrameBuffer &, const UL &, ui32_t)"
                 );
  }
  uVar3 = *(uint *)((label->super_Identifier<16U>).m_Value + 0xf);
  if (*(uint *)((label->super_Identifier<16U>).m_Value + 7) < uVar3 + 0x14) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"Small write buffer\n");
  }
  else {
    uVar4 = *(undefined8 *)((long)plVar6 + 0x11);
    puVar2 = (undefined8 *)(*(long *)&(label->super_Identifier<16U>).m_HasValue + (ulong)uVar3);
    *puVar2 = *(undefined8 *)((long)plVar6 + 9);
    puVar2[1] = uVar4;
    cVar5 = Kumu::write_BER((uchar *)(*(long *)&(label->super_Identifier<16U>).m_HasValue + 0x10 +
                                     (ulong)*(uint *)((label->super_Identifier<16U>).m_Value + 0xf))
                            ,(ulong)in_R8D,4);
    if (cVar5 != '\0') {
      pbVar1 = (label->super_Identifier<16U>).m_Value + 0xf;
      *(int *)pbVar1 = *(int *)pbVar1 + 0x14;
      puVar7 = Kumu::RESULT_OK;
      goto LAB_00191656;
    }
  }
  puVar7 = Kumu::RESULT_FAIL;
LAB_00191656:
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar7);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::KLVPacket::WriteKLToBuffer(ASDCP::FrameBuffer& Buffer, const UL& label, ui32_t length)
{
  assert(label.HasValue());

  if ( Buffer.Size() + kl_length > Buffer.Capacity() )
    {
      DefaultLogSink().Error("Small write buffer\n");
      return RESULT_FAIL;
    }
  
  memcpy(Buffer.Data() + Buffer.Size(), label.Value(), label.Size());

  if ( ! Kumu::write_BER(Buffer.Data() + Buffer.Size() + SMPTE_UL_LENGTH, length, MXF_BER_LENGTH) )
    return RESULT_FAIL;

  Buffer.Size(Buffer.Size() + kl_length);
  return RESULT_OK;
}